

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O0

void __thiscall
wasm::RandomElement<wasm::RandomFullLattice>::RandomElement
          (RandomElement<wasm::RandomFullLattice> *this,
          RandomElement<wasm::RandomFullLattice> *other)

{
  anon_class_8_1_a86c6e30 local_48;
  ElementImpl local_40;
  RandomElement<wasm::RandomFullLattice> *local_18;
  RandomElement<wasm::RandomFullLattice> *other_local;
  RandomElement<wasm::RandomFullLattice> *this_local;
  
  local_48.other = other;
  local_18 = other;
  other_local = this;
  RandomElement::anon_class_8_1_a86c6e30::operator()(&local_40,&local_48);
  RandomElement(this,&local_40);
  RandomFullLattice::ElementImpl::~ElementImpl(&local_40);
  return;
}

Assistant:

RandomElement(const RandomElement& other)
    : RandomElement([&]() {
        auto copy = *other;
        return copy;
      }()) {}